

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clump.cpp
# Opt level: O1

bool __thiscall rw::Atomic::streamWriteClump(Atomic *this,Stream *stream,FrameList_ *frmlst)

{
  Clump *pCVar1;
  uint32 size;
  int32 iVar2;
  int iVar3;
  LLLink *pLVar4;
  bool bVar5;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  pCVar1 = this->clump;
  if (pCVar1 != (Clump *)0x0) {
    size = streamGetSize(this);
    writeChunkHeader(stream,0x14,size);
    writeChunkHeader(stream,1,(uint)(0x303ff < version) * 4 + 0xc);
    iVar2 = findPointer((this->object).object.parent,frmlst->frames,frmlst->numFrames);
    if (version < 0x30400) {
      local_38 = (ulong)CONCAT14((this->object).object.flags,iVar2);
      Stream::write32(stream,&local_38,0xc);
      Geometry::streamWrite(this->geometry,stream);
LAB_0012ed68:
      PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
      return true;
    }
    pLVar4 = (pCVar1->atomics).link.next;
    bVar5 = pLVar4 == &(pCVar1->atomics).link;
    if (!bVar5) {
      if ((Geometry *)pLVar4[-3].next == this->geometry) {
        iVar3 = 0;
      }
      else {
        iVar3 = 0;
        do {
          pLVar4 = pLVar4->next;
          iVar3 = iVar3 + 1;
          bVar5 = pLVar4 == &(pCVar1->atomics).link;
          if (bVar5) {
            return false;
          }
        } while ((Geometry *)pLVar4[-3].next != this->geometry);
      }
      local_38 = CONCAT44(iVar3,iVar2);
      if (!bVar5) {
        uStack_30 = CONCAT44(uStack_30._4_4_,(uint)(this->object).object.flags);
        Stream::write32(stream,&local_38,0x10);
        goto LAB_0012ed68;
      }
    }
  }
  return false;
}

Assistant:

bool
Atomic::streamWriteClump(Stream *stream, FrameList_ *frmlst)
{
	int32 buf[4] = { 0, 0, 0, 0 };
	Clump *c = this->clump;
	if(c == nil)
		return false;
	writeChunkHeader(stream, ID_ATOMIC, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, rw::version < 0x30400 ? 12 : 16);
	buf[0] = findPointer(this->getFrame(), (void**)frmlst->frames, frmlst->numFrames);

	if(version < 0x30400){
		buf[1] = this->object.object.flags;
		stream->write32(buf, sizeof(int32[3]));
		this->geometry->streamWrite(stream);
	}else{
		buf[1] = 0;
		FORLIST(lnk, c->atomics){
			if(Atomic::fromClump(lnk)->geometry == this->geometry)
				goto foundgeo;
			buf[1]++;
		}
		return false;
	foundgeo:
		buf[2] = this->object.object.flags;
		stream->write32(buf, sizeof(buf));
	}

	s_plglist.streamWrite(stream, this);
	return true;
}